

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  basic_format_specs<wchar_t> *pbVar5;
  wchar_t wVar6;
  uint uVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  string groups;
  string local_118;
  format_specs local_f8;
  ulong local_c8;
  ulong uStack_c0;
  wchar_t local_b8 [2];
  wchar_t awStack_b0 [2];
  wchar_t local_a8;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_98;
  
  grouping_impl<wchar_t>(&local_118,(locale_ref)(this->writer->locale_).locale_);
  if (local_118._M_string_length == 0) {
    on_dec(this);
  }
  else {
    wVar6 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
    if (wVar6 == L'\0') {
      on_dec(this);
    }
    else {
      uVar3 = (ulong)this->abs_value;
      uVar4 = *(ulong *)((long)&this->abs_value + 8);
      auVar15 = (undefined1  [16])this->abs_value;
      uVar14 = 1;
      if ((uVar3 < 10) <= uVar4) {
        uVar7 = 4;
        do {
          uVar14 = uVar7;
          uVar8 = auVar15._8_8_;
          uVar13 = auVar15._0_8_;
          if (uVar8 == 0 && (ulong)(99 < uVar13) <= -uVar8) {
            uVar14 = uVar14 - 2;
            goto LAB_0018cb01;
          }
          if (uVar8 == 0 && (ulong)(999 < uVar13) <= -uVar8) {
            uVar14 = uVar14 - 1;
            goto LAB_0018cb01;
          }
          if (uVar8 < (uVar13 < 10000)) goto LAB_0018cb01;
          auVar15 = __udivti3(uVar13,uVar8,10000,0);
          uVar7 = uVar14 + 4;
        } while (uVar8 != 0 || -uVar8 < (ulong)(99999 < uVar13));
        uVar14 = uVar14 + 1;
      }
LAB_0018cb01:
      local_98.f.groups = &local_118;
      pcVar1 = local_118._M_dataplus._M_p + local_118._M_string_length;
      _Var10._M_p = local_118._M_dataplus._M_p;
      local_98.f.size = uVar14;
      uVar7 = uVar14;
      if (local_118._M_string_length != 0) {
        uVar11 = (int)local_118._M_string_length + uVar14;
        _Var9._M_p = local_118._M_dataplus._M_p;
        do {
          cVar2 = *_Var9._M_p;
          uVar12 = uVar7 - (int)cVar2;
          _Var10._M_p = _Var9._M_p;
          local_98.f.size = uVar14;
          if ((uVar12 == 0 || (int)uVar7 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar14 = uVar14 + 1;
          _Var9._M_p = _Var9._M_p + 1;
          local_118._M_string_length = local_118._M_string_length - 1;
          _Var10._M_p = pcVar1;
          local_98.f.size = uVar11;
          uVar7 = uVar12;
        } while (local_118._M_string_length != 0);
      }
      if (_Var10._M_p == pcVar1) {
        local_98.f.size = (int)(uVar7 - 1) / (int)pcVar1[-1] + local_98.f.size;
      }
      pbVar5 = this->specs;
      local_98.prefix.size_ = (size_t)this->prefix_size;
      local_f8.fill.data_[5] = (pbVar5->fill).data_[5];
      local_f8.width = pbVar5->width;
      local_f8.precision = pbVar5->precision;
      uStack_c0._0_1_ = pbVar5->type;
      uStack_c0._1_3_ = *(undefined3 *)&pbVar5->field_0x9;
      uStack_c0._4_4_ = (pbVar5->fill).data_[0];
      local_f8.fill.data_._4_8_ = *(undefined8 *)((pbVar5->fill).data_ + 1);
      local_f8.fill.data_._12_8_ = *(undefined8 *)((pbVar5->fill).data_ + 3);
      uVar8 = (uint)local_98.f.size + local_98.prefix.size_;
      local_f8._9_1_ = SUB31(uStack_c0._1_3_,0);
      local_98.size_ = uVar8;
      local_98.fill = uStack_c0._4_4_;
      if ((local_f8._9_1_ & 0xf) == 4) {
        uVar13 = local_f8._0_8_ & 0xffffffff;
        local_98.padding = 0;
        if (uVar8 <= uVar13) {
          local_98.size_ = uVar13;
          local_98.padding = uVar13 - uVar8;
        }
      }
      else if (local_98.f.size < (int)local_f8.precision) {
        local_98.size_ = (uint)local_f8.precision + local_98.prefix.size_;
        local_98.padding = (ulong)(uint)(local_f8.precision - local_98.f.size);
        local_98.fill = L'0';
      }
      else {
        local_98.padding = 0;
      }
      local_98.prefix.data_ = this->prefix;
      local_f8._8_8_ = uStack_c0;
      if ((uStack_c0 & 0xf00) == 0) {
        local_f8._8_8_ = uStack_c0 | 0x200;
      }
      local_c8 = local_f8._0_8_;
      local_b8 = (wchar_t  [2])local_f8.fill.data_._4_8_;
      awStack_b0 = (wchar_t  [2])local_f8.fill.data_._12_8_;
      local_a8 = local_f8.fill.data_[5];
      local_98.f.abs_value._0_8_ = uVar3;
      local_98.f.abs_value._8_8_ = uVar4;
      local_98.f.sep = wVar6;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_f8,&local_98);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }